

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O2

void av1_encode_intra_block_plane
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int plane,RUN_TYPE dry_run,
               TRELLIS_OPT_TYPE enable_optimize_b)

{
  BLOCK_SIZE plane_bsize;
  encode_b_args arg;
  ENTROPY_CONTEXT tl [32];
  ENTROPY_CONTEXT ta [32];
  AV1_COMP *local_98;
  MACROBLOCK *local_90;
  undefined8 local_88;
  undefined8 *local_80;
  ENTROPY_CONTEXT *local_78;
  RUN_TYPE local_70;
  TRELLIS_OPT_TYPE local_6f;
  ENTROPY_CONTEXT local_68 [32];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if ((plane == 0) || ((x->e_mbd).is_chroma_ref == true)) {
    local_80 = &local_48;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_78 = local_68;
    local_68[0x10] = '\0';
    local_68[0x11] = '\0';
    local_68[0x12] = '\0';
    local_68[0x13] = '\0';
    local_68[0x14] = '\0';
    local_68[0x15] = '\0';
    local_68[0x16] = '\0';
    local_68[0x17] = '\0';
    local_68[0x18] = '\0';
    local_68[0x19] = '\0';
    local_68[0x1a] = '\0';
    local_68[0x1b] = '\0';
    local_68[0x1c] = '\0';
    local_68[0x1d] = '\0';
    local_68[0x1e] = '\0';
    local_68[0x1f] = '\0';
    local_88 = 0;
    local_68[0] = '\0';
    local_68[1] = '\0';
    local_68[2] = '\0';
    local_68[3] = '\0';
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    local_68[8] = '\0';
    local_68[9] = '\0';
    local_68[10] = '\0';
    local_68[0xb] = '\0';
    local_68[0xc] = '\0';
    local_68[0xd] = '\0';
    local_68[0xe] = '\0';
    local_68[0xf] = '\0';
    plane_bsize = av1_ss_size_lookup[bsize][(x->e_mbd).plane[plane].subsampling_x]
                  [(x->e_mbd).plane[plane].subsampling_y];
    local_98 = cpi;
    local_90 = x;
    local_70 = dry_run;
    local_6f = enable_optimize_b;
    if (enable_optimize_b != '\0') {
      av1_get_entropy_contexts
                (plane_bsize,(x->e_mbd).plane + plane,(ENTROPY_CONTEXT *)&local_48,local_68);
    }
    av1_foreach_transformed_block_in_plane
              (&x->e_mbd,plane_bsize,plane,encode_block_intra_and_set_context,&local_98);
  }
  return;
}

Assistant:

void av1_encode_intra_block_plane(const struct AV1_COMP *cpi, MACROBLOCK *x,
                                  BLOCK_SIZE bsize, int plane, RUN_TYPE dry_run,
                                  TRELLIS_OPT_TYPE enable_optimize_b) {
  assert(bsize < BLOCK_SIZES_ALL);
  const MACROBLOCKD *const xd = &x->e_mbd;
  if (plane && !xd->is_chroma_ref) return;

  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const int ss_x = pd->subsampling_x;
  const int ss_y = pd->subsampling_y;
  ENTROPY_CONTEXT ta[MAX_MIB_SIZE] = { 0 };
  ENTROPY_CONTEXT tl[MAX_MIB_SIZE] = { 0 };
  struct encode_b_args arg = {
    cpi, x, NULL, ta, tl, dry_run, enable_optimize_b
  };
  const BLOCK_SIZE plane_bsize = get_plane_block_size(bsize, ss_x, ss_y);
  if (enable_optimize_b) {
    av1_get_entropy_contexts(plane_bsize, pd, ta, tl);
  }
  av1_foreach_transformed_block_in_plane(
      xd, plane_bsize, plane, encode_block_intra_and_set_context, &arg);
}